

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  string *psVar1;
  char *__s;
  string *extraout_RAX;
  size_t sVar2;
  string *extraout_RAX_00;
  long *plVar3;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  long lVar4;
  long *local_58;
  ulong local_50;
  long local_48 [2];
  string *local_38;
  
  local_38 = __return_storage_ptr__;
  if (environment_variables._M_array != (iterator)0x0) {
    lVar4 = 0;
    do {
      __s = getenv(*(char **)(this + lVar4));
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        sVar2 = strlen(__s);
        psVar1 = local_38;
        if (__s[sVar2 - 1] == '/') {
          (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
          sVar2 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)psVar1,__s,__s + sVar2);
          return extraout_RAX_00;
        }
        local_58 = local_48;
        sVar2 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar2);
        plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_50,0,'\x01');
        (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
        std::__cxx11::string::_M_construct<char*>((string *)local_38,*plVar3,plVar3[1] + *plVar3);
        if (local_58 == local_48) {
          return extraout_RAX_01;
        }
        operator_delete(local_58,local_48[0] + 1);
        return extraout_RAX_02;
      }
      lVar4 = lVar4 + 8;
    } while ((long)environment_variables._M_array << 3 != lVar4);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,(char *)environment_variables._M_len,(allocator<char> *)&local_58);
  return extraout_RAX;
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}